

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager_p.h
# Opt level: O3

void __thiscall
QNetworkAccessManagerPrivate::QNetworkAccessManagerPrivate(QNetworkAccessManagerPrivate *this)

{
  _Rb_tree_header *p_Var1;
  long in_FS_OFFSET;
  undefined1 local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QNetworkAccessManagerPrivate_002cac50;
  this->networkCache = (QAbstractNetworkCache *)0x0;
  this->cookieJar = (QNetworkCookieJar *)0x0;
  this->thread = (QThread *)0x0;
  QNetworkProxy::QNetworkProxy(&this->proxy);
  this->proxyFactory = (QNetworkProxyFactory *)0x0;
  this->cookieJarCreated = false;
  this->defaultAccessControl = true;
  this->redirectPolicy = NoLessSafeRedirectPolicy;
  std::__shared_ptr<QNetworkAccessAuthenticationManager,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<QNetworkAccessAuthenticationManager>>
            ((__shared_ptr<QNetworkAccessAuthenticationManager,(__gnu_cxx::_Lock_policy)2> *)
             &this->authenticationManager,
             (allocator<QNetworkAccessAuthenticationManager> *)&local_19);
  p_Var1 = &(this->stsCache).knownHosts._M_t._M_impl.super__Rb_tree_header;
  (this->stsCache).knownHosts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stsCache).knownHosts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->stsCache).knownHosts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->stsCache).knownHosts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->transferTimeout).__r = 0;
  (this->stsCache).knownHosts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->stsCache).hstsStore = (QHstsStore *)0x0;
  *(undefined8 *)((long)&(this->stsCache).hstsStore + 2) = 0;
  *(undefined8 *)((long)&(this->stsStore).d + 2) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkAccessManagerPrivate()
        : networkCache(nullptr),
          cookieJar(nullptr),
          thread(nullptr),
#ifndef QT_NO_NETWORKPROXY
          proxyFactory(nullptr),
#endif
          cookieJarCreated(false),
          defaultAccessControl(true),
          redirectPolicy(QNetworkRequest::NoLessSafeRedirectPolicy),
          authenticationManager(std::make_shared<QNetworkAccessAuthenticationManager>())
    {
    }